

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playera.cpp
# Opt level: O1

UINT8 __thiscall PlayerA::Stop(PlayerA *this)

{
  UINT8 UVar1;
  int iVar2;
  int iVar3;
  
  if (this->_player == (PlayerBase *)0x0) {
    UVar1 = 0xff;
  }
  else {
    iVar2 = (*this->_player->_vptr_PlayerBase[0x20])();
    iVar3 = (*this->_player->_vptr_PlayerBase[0x19])();
    this->_myPlayState = (byte)iVar3 & 3 | 0x20;
    UVar1 = (UINT8)iVar2;
  }
  return UVar1;
}

Assistant:

UINT8 PlayerA::Stop(void)
{
	if (_player == NULL)
		return 0xFF;
	UINT8 retVal = _player->Stop();
	_myPlayState = _player->GetState() & (PLAYSTATE_PLAY | PLAYSTATE_END);
	_myPlayState |= PLAYSTATE_FIN;
	return retVal;
}